

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_cb_prg.c
# Opt level: O0

void progressbarinit(ProgressData *bar,OperationConfig *config)

{
  char *pcVar1;
  int iVar2;
  size_t sVar3;
  undefined1 local_3c [2];
  ushort local_3a;
  winsize ts;
  int cols;
  long num;
  char *endptr;
  char *colp;
  OperationConfig *config_local;
  ProgressData *bar_local;
  
  colp = (char *)config;
  config_local = (OperationConfig *)bar;
  memset(bar,0,0x48);
  if ((colp[0x50] & 1U) != 0) {
    config_local->cookiejar = *(char **)(colp + 0x80);
  }
  endptr = (char *)curl_getenv();
  if (endptr != (char *)0x0) {
    register0x00000000 = strtol(endptr,(char **)&num,10);
    pcVar1 = endptr;
    if ((((char *)num != endptr) && (sVar3 = strlen(endptr), (char *)num == pcVar1 + sVar3)) &&
       (0x14 < stack0xffffffffffffffd0)) {
      *(int *)&config_local->useragent = (int)stack0xffffffffffffffd0;
    }
    curl_free();
  }
  if (*(int *)&config_local->useragent == 0) {
    ts.ws_row = 0;
    ts.ws_col = 0;
    iVar2 = ioctl(0,0x5413,local_3c);
    if (iVar2 == 0) {
      ts._0_4_ = ZEXT24(local_3a);
    }
    *(undefined4 *)&config_local->useragent = ts._0_4_;
  }
  if (*(int *)&config_local->useragent == 0) {
    *(undefined4 *)&config_local->useragent = 0x4f;
  }
  else if (0x100 < *(int *)&config_local->useragent) {
    *(undefined4 *)&config_local->useragent = 0x100;
  }
  config_local->cookie = *(char **)(*(long *)(colp + 0x468) + 0x10);
  *(undefined4 *)&config_local->cookiefile = 0x96;
  config_local->cookiesession = true;
  config_local->encoding = false;
  config_local->tr_encoding = false;
  config_local->field_0x43 = 0;
  return;
}

Assistant:

void progressbarinit(struct ProgressData *bar,
                     struct OperationConfig *config)
{
  char *colp;
  memset(bar, 0, sizeof(struct ProgressData));

  /* pass this through to progress function so
   * it can display progress towards total file
   * not just the part that's left. (21-may-03, dbyron) */
  if(config->use_resume)
    bar->initial_size = config->resume_from;

  colp = curlx_getenv("COLUMNS");
  if(colp) {
    char *endptr;
    long num = strtol(colp, &endptr, 10);
    if((endptr != colp) && (endptr == colp + strlen(colp)) && (num > 20))
      bar->width = (int)num;
    curl_free(colp);
  }

  if(!bar->width) {
    int cols = 0;

#ifdef TIOCGSIZE
    struct ttysize ts;
    if(!ioctl(STDIN_FILENO, TIOCGSIZE, &ts))
      cols = ts.ts_cols;
#elif defined(TIOCGWINSZ)
    struct winsize ts;
    if(!ioctl(STDIN_FILENO, TIOCGWINSZ, &ts))
      cols = ts.ws_col;
#elif defined(_WIN32)
    {
      HANDLE  stderr_hnd = GetStdHandle(STD_ERROR_HANDLE);
      CONSOLE_SCREEN_BUFFER_INFO console_info;

      if((stderr_hnd != INVALID_HANDLE_VALUE) &&
         GetConsoleScreenBufferInfo(stderr_hnd, &console_info)) {
        /*
         * Do not use +1 to get the true screen-width since writing a
         * character at the right edge will cause a line wrap.
         */
        cols = (int)
          (console_info.srWindow.Right - console_info.srWindow.Left);
      }
    }
#endif /* TIOCGSIZE */
    bar->width = cols;
  }

  if(!bar->width)
    bar->width = 79;
  else if(bar->width > MAX_BARLENGTH)
    bar->width = MAX_BARLENGTH;

  bar->out = config->global->errors;
  bar->tick = 150;
  bar->barmove = 1;
}